

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::Matchers::MatcherUntypedBase::toString_abi_cxx11_
          (string *__return_storage_ptr__,MatcherUntypedBase *this)

{
  ulong uVar1;
  string local_38 [32];
  MatcherUntypedBase *local_18;
  MatcherUntypedBase *this_local;
  
  local_18 = this;
  this_local = (MatcherUntypedBase *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    (*this->_vptr_MatcherUntypedBase[2])(local_38);
    std::__cxx11::string::operator=((string *)&this->m_cachedToString,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_cachedToString);
  return __return_storage_ptr__;
}

Assistant:

std::string MatcherUntypedBase::toString() const {
            if (m_cachedToString.empty()) {
                m_cachedToString = describe();
            }
            return m_cachedToString;
        }